

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_load_submodules(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  ushort uVar1;
  lyd_node **pplVar2;
  lysp_submodule *plVar3;
  long lVar4;
  long lVar5;
  lyd_node *plVar6;
  int iVar7;
  LY_ERR LVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  undefined8 *puVar12;
  lyd_node_inner **pplVar13;
  ly_set *plVar14;
  char *pcVar15;
  char **str_p;
  ulong uVar16;
  char *pcVar17;
  lysp_include *plVar18;
  long lVar19;
  undefined8 *puVar20;
  ulong uVar21;
  ly_ctx *ctx;
  ly_ctx *plVar22;
  lyd_node_inner *plVar23;
  lysp_include *plVar24;
  long *plVar25;
  lysp_revision *__s2;
  undefined8 uVar26;
  LYS_INFORMAT format;
  lyd_node *local_b8;
  ly_ctx *local_b0;
  ulong local_a8;
  lysp_submodule *submod;
  long *local_98;
  lysp_module *local_90;
  char *submodule_data;
  undefined8 *local_80;
  ly_set *local_78;
  ly_set *local_70;
  ly_in *in;
  _func_void_void_ptr_void_ptr *submodule_data_free;
  lysp_load_module_check_data check_data;
  
  if (pctx == (lysp_ctx *)0x0) {
    local_b0 = (ly_ctx *)0x0;
  }
  else {
    local_b0 = (ly_ctx *)
               **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  uVar21 = 0;
  local_90 = pmod;
  local_78 = new_mods;
LAB_00160fe1:
  plVar24 = pmod->includes;
  if (plVar24 == (lysp_include *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(ulong *)(plVar24[-1].rev + 8);
  }
  if (uVar9 <= uVar21) {
    return LY_SUCCESS;
  }
  submod = (lysp_submodule *)0x0;
  if (plVar24[uVar21].submodule == (lysp_submodule *)0x0) {
    plVar24 = plVar24 + uVar21;
    plVar14 = pctx->parsed_mods;
    local_a8 = CONCAT71(local_a8._1_7_,pmod->field_0x79);
    if ((pmod->field_0x79 & 2) == 0) {
      uVar9 = (ulong)(plVar14->count - 1);
    }
    else {
      uVar9 = (ulong)(plVar14->count - 1);
      local_b8 = (plVar14->field_2).dnodes[uVar9];
      local_80 = *(undefined8 **)local_b8;
      local_98 = (long *)local_80[10];
      lVar4 = local_98[3];
      uVar16 = 0xffffffffffffffff;
      __s2 = (lysp_revision *)(lVar4 + -0x10);
      local_70 = plVar14;
      do {
        pcVar17 = __s2->date;
        if (lVar4 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = *(ulong *)(lVar4 + -8);
        }
        uVar16 = uVar16 + 1;
        if (uVar10 <= uVar16) {
          plVar14 = local_70;
          if ((char)local_98[0xf] == '\x02') {
            if (pctx == (lysp_ctx *)0x0) {
              plVar22 = (ly_ctx *)0x0;
            }
            else {
              plVar22 = (ly_ctx *)*local_80;
            }
            ly_vlog(plVar22,(char *)0x0,LYVE_REFERENCE,
                    "YANG 1.1 requires all submodules to be included from main module. But submodule \"%s\" includes submodule \"%s\" which is not included by main module \"%s\"."
                    ,local_b8[2].parent,plVar24->name,*(undefined8 *)(*local_98 + 8));
            return LY_EVALID;
          }
          goto LAB_001610ee;
        }
        pcVar15 = *(char **)(pcVar17 + 0x18);
        __s2 = (lysp_revision *)(pcVar17 + 0x38);
        iVar7 = strcmp(pcVar15,plVar24->name);
      } while (iVar7 != 0);
      if ((plVar24->rev[0] != '\0') && (iVar7 = strncmp(plVar24->rev,(char *)__s2,0xb), iVar7 != 0))
      {
        if (pctx == (lysp_ctx *)0x0) {
          plVar22 = (ly_ctx *)0x0;
        }
        else {
          plVar22 = (ly_ctx *)*local_80;
        }
        plVar23 = local_b8[2].parent;
        uVar26 = *(undefined8 *)(*local_98 + 8);
LAB_001615dd:
        ly_vlog(plVar22,(char *)0x0,LYVE_REFERENCE,
                "Submodule %s includes different revision (%s) of the submodule %s:%s included by the main module %s."
                ,plVar23,plVar24->rev,pcVar15,__s2,uVar26);
        return LY_EVALID;
      }
      plVar3 = *(lysp_submodule **)(pcVar17 + 0x10);
      plVar24->submodule = plVar3;
      plVar14 = local_70;
      if (plVar3 != (lysp_submodule *)0x0) {
        return LY_SUCCESS;
      }
    }
LAB_001610ee:
    if ((int)uVar9 != 0) {
      pplVar2 = (plVar14->field_2).dnodes;
      uVar16 = 0;
      do {
        plVar3 = (lysp_submodule *)pplVar2[uVar16];
        if ((plVar3->field_0x79 & 2) != 0) {
          pcVar15 = plVar3->name;
          iVar7 = strcmp(pcVar15,plVar24->name);
          if (iVar7 == 0) {
            if (((plVar24->rev[0] == '\0') || (__s2 = plVar3->revs, __s2 == (lysp_revision *)0x0))
               || (iVar7 = strncmp(plVar24->rev,__s2->date,0xb), iVar7 == 0)) {
              plVar24->submodule = plVar3;
              return LY_SUCCESS;
            }
            plVar6 = pplVar2[uVar9];
            puVar20 = *(undefined8 **)plVar6;
            plVar23 = plVar6[2].parent;
            plVar22 = (ly_ctx *)*puVar20;
            uVar26 = puVar20[1];
            goto LAB_001615dd;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar9 != uVar16);
    }
    pmod = local_90;
    plVar22 = local_b0;
    uVar1 = local_b0->flags;
    if ((uVar1 & 0x20) != 0) goto LAB_001612ba;
    do {
      if (plVar22->imp_clb != (ly_module_imp_clb)0x0) {
        submodule_data = (char *)0x0;
        format = LYS_IN_UNKNOWN;
        submodule_data_free = (_func_void_void_ptr_void_ptr *)0x0;
        check_data.path = (char *)0x0;
        check_data.submoduleof = (char *)0x0;
        check_data.name = (char *)0x0;
        check_data.revision = (char *)0x0;
        pcVar17 = plVar24->rev;
        pcVar15 = pcVar17;
        if (plVar24->rev[0] == '\0') {
          pcVar15 = (char *)0x0;
        }
        LVar8 = (*plVar22->imp_clb)(*(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes
                                                        [pctx->parsed_mods->count - 1] + 8),
                                    (char *)0x0,plVar24->name,pcVar15,plVar22->imp_clb_data,&format,
                                    &submodule_data,&submodule_data_free);
        if (LVar8 == LY_SUCCESS) {
          LVar8 = ly_in_new_memory(submodule_data,&in);
          if (LVar8 != LY_SUCCESS) {
            return LVar8;
          }
          check_data.name = plVar24->name;
          if (plVar24->rev[0] == '\0') {
            pcVar17 = (char *)0x0;
          }
          check_data.submoduleof =
               *(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1]
                         + 8);
          check_data.revision = pcVar17;
          lys_parse_submodule(plVar22,in,format,pctx->main_ctx,lysp_load_module_check,&check_data,
                              local_78,&submod);
          plVar24 = pmod->includes + uVar21;
          ly_in_free(in,'\0');
          if (submodule_data_free != (_func_void_void_ptr_void_ptr *)0x0) {
            (*submodule_data_free)(submodule_data,plVar22->imp_clb_data);
          }
        }
      }
      if (submod != (lysp_submodule *)0x0) {
LAB_00161321:
        if ((plVar24->rev[0] == '\0') && ((submod->field_0x79 & 0xc) == 4)) {
          submod->field_0x79 = submod->field_0x79 & 0xf3 | 8;
        }
        plVar24->submodule = submod;
        if ((local_a8 & 2) == 0) goto LAB_00161545;
        plVar18 = pmod->includes + uVar21;
        puVar20 = *(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        uVar9 = puVar20[10];
        lVar4 = *(long *)(uVar9 + 0x18);
        if (lVar4 == 0) {
          puVar12 = (undefined8 *)malloc(0x40);
          if (puVar12 == (undefined8 *)0x0) {
            plVar22 = (ly_ctx *)*puVar20;
            goto LAB_00161735;
          }
          *puVar12 = 1;
          *(undefined8 **)(uVar9 + 0x18) = puVar12 + 1;
          plVar25 = puVar12 + 8;
          str_p = (char **)(puVar12 + 2);
          puVar12[6] = 0;
          puVar12[7] = 0;
          puVar12[4] = 0;
          puVar12[5] = 0;
          puVar12[2] = 0;
          puVar12[3] = 0;
          puVar12[1] = plVar18->submodule;
          goto LAB_0016148a;
        }
        lVar5 = *(long *)(lVar4 + -8);
        local_a8 = uVar9;
        if (lVar5 == 0) goto LAB_001613b3;
        pcVar17 = plVar18->name;
        puVar20 = (undefined8 *)(lVar4 + 8);
        lVar19 = lVar5;
        goto LAB_00161396;
      }
      uVar1 = plVar22->flags;
      if ((uVar1 & 0x20) != 0) break;
LAB_001612ba:
      if ((uVar1 & 8) == 0) {
        pcVar17 = (char *)0x0;
        if (plVar24->rev[0] != '\0') {
          pcVar17 = plVar24->rev;
        }
        plVar14 = pctx->main_ctx->parsed_mods;
        lys_parse_localfile(plVar22,plVar24->name,pcVar17,pctx->main_ctx,
                            *(char **)(*(long *)(plVar14->field_2).dnodes[plVar14->count - 1] + 8),
                            '\x01',local_78,&submod);
        plVar24 = pmod->includes + uVar21;
      }
      if (submod != (lysp_submodule *)0x0) goto LAB_00161321;
    } while ((plVar22->flags & 0x20) != 0);
    goto LAB_0016153b;
  }
  goto LAB_00161545;
  while( true ) {
    puVar20 = puVar20 + 7;
    lVar19 = lVar19 + -1;
    if (lVar19 == 0) break;
LAB_00161396:
    iVar7 = strcmp((char *)*puVar20,pcVar17);
    if (iVar7 == 0) {
      puVar20[-1] = plVar18->submodule;
      plVar22 = local_b0;
      pmod = local_90;
      goto LAB_0016153b;
    }
  }
LAB_001613b3:
  *(long *)(lVar4 + -8) = lVar5 + 1;
  plVar11 = (long *)realloc((long *)(lVar4 + -8),lVar5 * 0x38 + 0x40);
  if (plVar11 == (long *)0x0) {
    plVar11 = (long *)(*(long *)(local_a8 + 0x18) + -8);
    *plVar11 = *plVar11 + -1;
    if (pctx == (lysp_ctx *)0x0) {
      plVar22 = (ly_ctx *)0x0;
    }
    else {
      plVar22 = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
    }
LAB_00161735:
    ly_log(plVar22,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_inject_submodule");
    return LY_EMEM;
  }
  lVar4 = *plVar11;
  *(long **)(local_a8 + 0x18) = plVar11 + 1;
  plVar25 = plVar11 + lVar4 * 7 + 1;
  str_p = (char **)(plVar11 + lVar4 * 7 + -5);
  plVar11[lVar4 * 7 + -1] = 0;
  (plVar11 + lVar4 * 7 + -1)[1] = 0;
  plVar11[lVar4 * 7 + -3] = 0;
  (plVar11 + lVar4 * 7 + -3)[1] = 0;
  plVar11[lVar4 * 7 + -5] = 0;
  (plVar11 + lVar4 * 7 + -5)[1] = 0;
  plVar11[lVar4 * 7 + -6] = (long)plVar18->submodule;
  plVar22 = local_b0;
  if (pctx == (lysp_ctx *)0x0) {
    LVar8 = lydict_dup((ly_ctx *)0x0,plVar18->name,str_p);
    plVar22 = local_b0;
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    LVar8 = lydict_dup((ly_ctx *)0x0,plVar18->dsc,(char **)(plVar11 + lVar4 * 7 + -4));
    ctx = (ly_ctx *)0x0;
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
  }
  else {
LAB_0016148a:
    LVar8 = lydict_dup((ly_ctx *)
                       **(undefined8 **)
                         (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1],
                       plVar18->name,str_p);
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    LVar8 = lydict_dup((ly_ctx *)
                       **(undefined8 **)
                         (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1],
                       plVar18->dsc,(char **)(plVar25 + -5));
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    ctx = (ly_ctx *)
          **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  LVar8 = lydict_dup(ctx,plVar18->ref,(char **)(plVar25 + -4));
  if (LVar8 != LY_SUCCESS) {
    return LVar8;
  }
  *(undefined4 *)((long)plVar25 + -9) = *(undefined4 *)(plVar18->rev + 7);
  plVar25[-2] = *(long *)plVar18->rev;
  *(undefined1 *)((long)plVar25 + -5) = 1;
  pmod = local_90;
LAB_0016153b:
  if (plVar24->submodule == (lysp_submodule *)0x0) {
    plVar6 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
    if (((ulong)plVar6[2].schema & 0x200) == 0) {
      pplVar13 = (lyd_node_inner **)(*(long *)plVar6 + 8);
    }
    else {
      pplVar13 = &plVar6[2].parent;
    }
    ly_vlog(plVar22,(char *)0x0,LYVE_REFERENCE,"Including \"%s\" submodule into \"%s\" failed.",
            plVar24->name,*pplVar13);
    return LY_EVALID;
  }
LAB_00161545:
  uVar21 = uVar21 + 1;
  goto LAB_00160fe1;
}

Assistant:

LY_ERR
lysp_load_submodules(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ctx *ctx = PARSER_CTX(pctx);

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ERR ret = LY_SUCCESS, r;
        struct lysp_submodule *submod = NULL;
        struct lysp_include *inc = &pmod->includes[u];

        if (inc->submodule) {
            continue;
        }

        if (pmod->is_submod) {
            /* try to find the submodule in the main module or its submodules */
            ret = lysp_main_pmod_get_submodule(pctx, inc);
            LY_CHECK_RET(ret != LY_ENOT, ret);
        }

        /* try to use currently parsed submodule */
        r = lysp_parsed_mods_get_submodule(pctx, inc);
        LY_CHECK_RET(r != LY_ENOT, r);

        /* submodule not present in the main module, get the input data and parse it */
        if (!(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
            if (ctx->imp_clb) {
                const char *submodule_data = NULL;
                LYS_INFORMAT format = LYS_IN_UNKNOWN;

                void (*submodule_data_free)(void *module_data, void *user_data) = NULL;
                struct lysp_load_module_check_data check_data = {0};
                struct ly_in *in;

                if (ctx->imp_clb(PARSER_CUR_PMOD(pctx)->mod->name, NULL, inc->name,
                        inc->rev[0] ? inc->rev : NULL, ctx->imp_clb_data,
                        &format, &submodule_data, &submodule_data_free) == LY_SUCCESS) {
                    LY_CHECK_RET(ly_in_new_memory(submodule_data, &in));
                    check_data.name = inc->name;
                    check_data.revision = inc->rev[0] ? inc->rev : NULL;
                    check_data.submoduleof = PARSER_CUR_PMOD(pctx)->mod->name;
                    lys_parse_submodule(ctx, in, format, pctx->main_ctx, lysp_load_module_check, &check_data, new_mods,
                            &submod);

                    /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                     * submodule's include into main module, where it is missing */
                    inc = &pmod->includes[u];

                    ly_in_free(in, 0);
                    if (submodule_data_free) {
                        submodule_data_free((void *)submodule_data, ctx->imp_clb_data);
                    }
                }
            }
            if (!submod && !(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_file;
            }
        } else {
search_file:
            if (!(ctx->flags & LY_CTX_DISABLE_SEARCHDIRS)) {
                /* submodule was not received from the callback or there is no callback set */
                lys_parse_localfile(ctx, inc->name, inc->rev[0] ? inc->rev : NULL, pctx->main_ctx,
                        PARSER_CUR_PMOD(pctx->main_ctx)->mod->name, 1, new_mods, (void **)&submod);

                /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                 * submodule's include into main module, where it is missing */
                inc = &pmod->includes[u];
            }
            if (!submod && (ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_clb;
            }
        }
        if (submod) {
            if (!inc->rev[0] && (submod->latest_revision == 1)) {
                /* update the latest_revision flag - here we have selected the latest available schema,
                 * consider that even the callback provides correct latest revision */
                submod->latest_revision = 2;
            }

            inc->submodule = submod;
            if (ret == LY_ENOT) {
                /* the submodule include is not present in YANG 1.0 main module - add it there */
                LY_CHECK_RET(lysp_inject_submodule(pctx, &pmod->includes[u]));
            }
        }
        if (!inc->submodule) {
            LOGVAL(ctx, LYVE_REFERENCE, "Including \"%s\" submodule into \"%s\" failed.", inc->name,
                    PARSER_CUR_PMOD(pctx)->is_submod ? ((struct lysp_submodule *)PARSER_CUR_PMOD(pctx))->name :
                    PARSER_CUR_PMOD(pctx)->mod->name);
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}